

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

Config * __thiscall QPDFJob::UOConfig::endUnderlayOverlay(UOConfig *this)

{
  UnderOverlay *pUVar1;
  pointer pcVar2;
  Config *pCVar3;
  element_type *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_38;
  
  pCVar3 = this->config;
  peVar4 = (pCVar3->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pUVar1 = peVar4->under_overlay;
  if ((pUVar1->filename)._M_string_length == 0) {
    pcVar2 = (pUVar1->which)._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar2,pcVar2 + (pUVar1->which)._M_string_length);
    std::__cxx11::string::append((char *)&local_38);
    usage(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    pCVar3 = this->config;
    peVar4 = (pCVar3->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  peVar4->under_overlay = (UnderOverlay *)0x0;
  return pCVar3;
}

Assistant:

QPDFJob::Config*
QPDFJob::UOConfig::endUnderlayOverlay()
{
    if (config->o.m->under_overlay->filename.empty()) {
        usage(config->o.m->under_overlay->which + " file not specified");
    }
    config->o.m->under_overlay = nullptr;
    return this->config;
}